

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

void __thiscall
icu_63::RegexMatcher::RegexMatcher
          (RegexMatcher *this,UText *regexp,UText *input,uint32_t flags,UErrorCode *status)

{
  UBool UVar1;
  RegexPattern *pRVar2;
  undefined1 local_84 [8];
  UParseError pe;
  UErrorCode *status_local;
  uint32_t flags_local;
  UText *input_local;
  UText *regexp_local;
  RegexMatcher *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__RegexMatcher_002b5c80;
  init(this,(EVP_PKEY_CTX *)status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pRVar2 = RegexPattern::compile(regexp,flags,(UParseError *)local_84,status);
    this->fPatternOwned = pRVar2;
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      this->fPattern = this->fPatternOwned;
      init2(this,input,status);
    }
  }
  return;
}

Assistant:

RegexMatcher::RegexMatcher(UText *regexp, UText *input,
                           uint32_t flags, UErrorCode &status) {
    init(status);
    if (U_FAILURE(status)) {
        return;
    }
    UParseError    pe;
    fPatternOwned      = RegexPattern::compile(regexp, flags, pe, status);
    if (U_FAILURE(status)) {
        return;
    }

    fPattern           = fPatternOwned;
    init2(input, status);
}